

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void wl_keyboard_handle_key
               (void *data,wl_keyboard *keyboard,uint serial,uint time,uint key,uint state)

{
  int iVar1;
  char *pcVar2;
  int *local_38;
  xkb_keysym_t *syms;
  wl_data *wl_data;
  uint state_local;
  uint key_local;
  uint time_local;
  uint serial_local;
  wl_keyboard *keyboard_local;
  void *data_local;
  
  if (state != 0) {
    syms = (xkb_keysym_t *)data;
    wl_data._0_4_ = state;
    wl_data._4_4_ = key;
    state_local = time;
    key_local = serial;
    _time_local = keyboard;
    keyboard_local = (wl_keyboard *)data;
    xkb_state_key_get_syms(*(undefined8 *)((long)data + 0x48),key + 8,&local_38);
    iVar1 = *local_38;
    if (iVar1 == 0x20) {
      animate = (int)((animate != 0 ^ 0xffU) & 1);
      redisplay = (int)(animate != 0);
    }
    else {
      if (iVar1 == 0x74) {
        pcVar2 = getenv("NO_TEXTURE");
        if (pcVar2 == (char *)0x0) {
          setenv("NO_TEXTURE","1",1);
        }
        else {
          unsetenv("NO_TEXTURE");
        }
      }
      else {
        if (iVar1 == 0xff1b) {
          sighandler(0xf);
          return;
        }
        if (iVar1 == 0xff51) {
          view_ry = view_ry + 5.0;
        }
        else if (iVar1 == 0xff52) {
          view_rx = view_rx + 5.0;
        }
        else if (iVar1 == 0xff53) {
          view_ry = view_ry - 5.0;
        }
        else if (iVar1 == 0xff54) {
          view_rx = view_rx - 5.0;
        }
        else if (iVar1 == 0xff55) {
          view_tz = view_tz + -5.0;
        }
        else {
          if (iVar1 != 0xff56) {
            return;
          }
          view_tz = view_tz - -5.0;
        }
      }
      if (animate == 0) {
        redisplay = 1;
      }
    }
  }
  return;
}

Assistant:

static void wl_keyboard_handle_key(void *data, struct wl_keyboard *keyboard, unsigned int serial, unsigned int time, unsigned int key, unsigned int state)
{
  struct wl_data *wl_data = data;
  const xkb_keysym_t *syms;

  if (state == WL_KEYBOARD_KEY_STATE_RELEASED)
    return;

  xkb_key_get_syms(wl_data->xkb_state, key + 8, &syms);

  switch (syms[0]) {
    case XKB_KEY_Escape:
      sighandler(SIGTERM);
      return;
    case XKB_KEY_space:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case XKB_KEY_Page_Down:
      view_tz -= -5.0;
      break;
    case XKB_KEY_Page_Up:
      view_tz += -5.0;
      break;
    case XKB_KEY_Down:
      view_rx -= 5.0;
      break;
    case XKB_KEY_Up:
      view_rx += 5.0;
      break;
    case XKB_KEY_Right:
      view_ry -= 5.0;
      break;
    case XKB_KEY_Left:
      view_ry += 5.0;
      break;
    case XKB_KEY_t:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}